

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::prepare_root(Container *this)

{
  bool bVar1;
  int iVar2;
  ContextManager *pCVar3;
  value_type *pvVar4;
  undefined8 uVar5;
  TaskData *pTVar6;
  string local_310;
  path local_2f0;
  path local_2c8;
  string local_2a0;
  string local_280;
  path local_260;
  path local_238;
  string local_210;
  string local_1f0;
  path local_1d0;
  path local_1a8;
  string local_180;
  string local_160;
  string local_140;
  path local_120;
  undefined1 local_f8 [8];
  path proc_dir;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  error_code error;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  iVar2 = mount("none","/","none",0x44000,(void *)0x0);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot privatize mounts: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::error_code::error_code((error_code *)local_50);
  std::filesystem::create_directories(&this->root_,(error_code *)local_50);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_50);
  if (bVar1) {
    pCVar3 = ContextManager::get();
    pvVar4 = std::filesystem::__cxx11::path::c_str(&this->root_);
    std::error_code::message_abi_cxx11_(&local_90,(error_code *)local_50);
    uVar5 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_70,"Cannot create root directory (%s): %s",pvVar4,uVar5);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  pvVar4 = std::filesystem::__cxx11::path::c_str(&this->root_);
  iVar2 = mount("none",pvVar4,"tmpfs",0,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_b0,"Cannot mount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  pvVar4 = std::filesystem::__cxx11::path::c_str(&this->root_);
  iVar2 = mount("none",pvVar4,"tmpfs",0x20,"mode=755,size=1g");
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_((string *)&proc_dir._M_cmpts,"Cannot remount root tmpfs: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&proc_dir._M_cmpts);
    std::__cxx11::string::~string((string *)&proc_dir._M_cmpts);
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_120,(char (*) [5])"proc",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_f8,&this->root_,&local_120);
  std::filesystem::__cxx11::path::~path(&local_120);
  std::filesystem::create_directories((path *)local_f8,(error_code *)local_50);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_50);
  if (bVar1) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_140,"Cannot create \'/proc\' dir: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  pvVar4 = std::filesystem::__cxx11::path::c_str((path *)local_f8);
  iVar2 = mount("none",pvVar4,"proc",0,"");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_160,"Cannot mount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  pvVar4 = std::filesystem::__cxx11::path::c_str((path *)local_f8);
  iVar2 = mount("none",pvVar4,"proc",0x20,"hidepid=2");
  if (iVar2 < 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_180,"Cannot remount proc filesystem: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_1d0,(char (*) [5])"work",auto_format);
  std::filesystem::__cxx11::operator/(&local_1a8,&this->root_,&local_1d0);
  std::filesystem::__cxx11::path::operator=(&this->work_dir_,&local_1a8);
  std::filesystem::__cxx11::path::~path(&local_1a8);
  std::filesystem::__cxx11::path::~path(&local_1d0);
  std::filesystem::create_directories(&this->work_dir_,(error_code *)local_50);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_50);
  if (bVar1) {
    pCVar3 = ContextManager::get();
    std::error_code::message_abi_cxx11_(&local_210,(error_code *)local_50);
    uVar5 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_1f0,"Cannot create \'/work\' dir: %s",uVar5);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_260,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_238,&this->root_,&local_260);
  std::filesystem::create_directories(&local_238);
  std::filesystem::__cxx11::path::~path(&local_238);
  std::filesystem::__cxx11::path::~path(&local_260);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_50);
  if (bVar1) {
    pCVar3 = ContextManager::get();
    std::error_code::message_abi_cxx11_(&local_2a0,(error_code *)local_50);
    uVar5 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_280,"Cannot create \'/tmp\' dir: %s",uVar5);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_2f0,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_2c8,&this->root_,&local_2f0);
  pvVar4 = std::filesystem::__cxx11::path::c_str(&local_2c8);
  iVar2 = chmod(pvVar4,0x1ff);
  std::filesystem::__cxx11::path::~path(&local_2c8);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_310,"Cannot chmod() \'/tmp\': %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
  }
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if ((pTVar6->use_standard_binds & 1U) != 0) {
    Bind::apply_standard_rules(&this->root_,&this->work_dir_);
  }
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  return;
}

Assistant:

void Container::prepare_root() {
    if (mount("none", "/", "none", MS_REC | MS_PRIVATE, nullptr) != 0) {
        die(format("Cannot privatize mounts: %m"));
    }

    std::error_code error;
    fs::create_directories(root_, error);
    if (error) {
        die(format("Cannot create root directory (%s): %s", root_.c_str(), error.message().c_str()));
    }

    if (mount("none", root_.c_str(), "tmpfs", 0, "mode=755,size=1g") != 0) {
        die(format("Cannot mount root tmpfs: %m"));
    }
    if (mount("none", root_.c_str(), "tmpfs", MS_REMOUNT, "mode=755,size=1g") != 0) {
        die(format("Cannot remount root tmpfs: %m"));
    }

    fs::path proc_dir = root_ / "proc";
    fs::create_directories(proc_dir, error);
    if (error) {
        die(format("Cannot create '/proc' dir: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", 0, "") < 0) {
        die(format("Cannot mount proc filesystem: %m"));
    }
    if (mount("none", proc_dir.c_str(), "proc", MS_REMOUNT, "hidepid=2") < 0) {
        die(format("Cannot remount proc filesystem: %m"));
    }

    work_dir_ = root_ / "work";
    fs::create_directories(work_dir_, error);
    if (error) {
        die(format("Cannot create '/work' dir: %s", error.message().c_str()));
    }

    fs::create_directories(root_ / "tmp");
    if (error) {
        die(format("Cannot create '/tmp' dir: %s", error.message().c_str()));
    }
    if (chmod((root_ / "tmp").c_str(), 0777) != 0) {
        die(format("Cannot chmod() '/tmp': %m"));
    }

    if (task_data_->use_standard_binds) {
        Bind::apply_standard_rules(root_, work_dir_);
    }
}